

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct8x8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined1 (*pauVar47) [16];
  undefined1 (*pauVar48) [16];
  undefined1 (*pauVar49) [16];
  undefined1 (*pauVar50) [16];
  undefined1 (*pauVar51) [16];
  int in_ECX;
  uint in_EDX;
  __m128i *in_RSI;
  long in_RDI;
  __m128i *in_R8;
  undefined4 in_R9D;
  undefined4 in_register_0000008c;
  int iVar52;
  int iVar55;
  int iVar56;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar57;
  __m128i in0;
  __m128i in0_00;
  __m128i in0_01;
  __m128i in0_02;
  __m128i in0_03;
  __m128i in0_04;
  __m128i in0_05;
  __m128i in0_06;
  __m128i in1;
  __m128i in1_00;
  __m128i in1_01;
  __m128i in1_02;
  __m128i in1_03;
  __m128i in1_04;
  __m128i in1_05;
  __m128i in1_06;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  int log_range_out;
  int col;
  __m128i y;
  __m128i x;
  __m128i v7;
  __m128i v6;
  __m128i v5;
  __m128i v4;
  __m128i v3;
  __m128i v2;
  __m128i v1;
  __m128i v0;
  __m128i u7;
  __m128i u6;
  __m128i u5;
  __m128i u4;
  __m128i u3;
  __m128i u2;
  __m128i u1;
  __m128i u0;
  __m128i clamp_hi;
  __m128i clamp_lo;
  int log_range;
  __m128i rnding;
  __m128i cospi16;
  __m128i cospim16;
  __m128i cospi48;
  __m128i cospi32;
  __m128i cospi8;
  __m128i cospi40;
  __m128i cospim40;
  __m128i cospi24;
  __m128i cospim8;
  __m128i cospi56;
  int32_t *cospi;
  undefined4 in_stack_fffffffffffff5b8;
  int in_stack_fffffffffffff5bc;
  undefined4 in_stack_fffffffffffff5c0;
  int iVar58;
  longlong local_a38;
  longlong lStack_a30;
  longlong local_a28;
  longlong lStack_a20;
  int local_a10;
  int local_a0c;
  undefined1 local_a08 [16];
  undefined1 local_9f8 [16];
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  int local_9a8;
  int iStack_9a4;
  int iStack_9a0;
  int iStack_99c;
  int local_998;
  int iStack_994;
  int iStack_990;
  int iStack_98c;
  int local_988;
  int iStack_984;
  int iStack_980;
  int iStack_97c;
  int local_978;
  int iStack_974;
  int iStack_970;
  int iStack_96c;
  undefined8 local_968;
  undefined8 uStack_960;
  int local_958;
  int iStack_954;
  int iStack_950;
  int iStack_94c;
  int local_948;
  int iStack_944;
  int iStack_940;
  int iStack_93c;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  int local_8bc;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  int32_t *local_808;
  int local_7fc;
  int local_7f8;
  uint local_7f4;
  __m128i *local_7f0;
  long local_7e8;
  uint local_7dc;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  uint local_7bc;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  uint local_79c;
  undefined8 local_798;
  undefined8 uStack_790;
  uint local_77c;
  undefined8 local_778;
  undefined8 uStack_770;
  uint local_75c;
  undefined8 local_758;
  undefined8 uStack_750;
  uint local_73c;
  undefined8 local_738;
  undefined8 uStack_730;
  uint local_71c;
  undefined8 local_718;
  undefined8 uStack_710;
  uint local_6fc;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  uint local_6dc;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  uint local_6bc;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  int local_424;
  int local_420;
  int local_41c;
  int local_418;
  int local_414;
  int32_t local_410;
  int local_40c;
  int32_t local_408;
  int32_t local_404;
  int32_t local_400;
  int32_t local_3fc;
  int local_3f8;
  int32_t local_3f4;
  int local_3f0;
  int32_t local_3ec;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  int32_t local_1d8;
  int32_t local_1d4;
  int32_t local_1d0;
  int32_t local_1cc;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  int32_t local_198;
  int32_t local_194;
  int32_t local_190;
  int32_t local_18c;
  undefined8 local_188;
  undefined8 uStack_180;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  undefined8 local_168;
  undefined8 uStack_160;
  int32_t local_158;
  int32_t local_154;
  int32_t local_150;
  int32_t local_14c;
  undefined8 local_148;
  undefined8 uStack_140;
  int32_t local_138;
  int32_t local_134;
  int32_t local_130;
  int32_t local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  int32_t local_118;
  int32_t local_114;
  int32_t local_110;
  int32_t local_10c;
  undefined8 local_108;
  undefined8 uStack_100;
  int32_t local_f8;
  int32_t local_f4;
  int32_t local_f0;
  int32_t local_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  int32_t local_b8;
  int32_t local_b4;
  int32_t local_b0;
  int32_t local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  longlong local_48;
  longlong lStack_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  longlong local_28;
  longlong lStack_20;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  local_7fc = (int)in_R8;
  local_7f8 = in_ECX;
  local_7f4 = in_EDX;
  local_7f0 = in_RSI;
  local_7e8 = in_RDI;
  local_808 = cospi_arr(in_EDX);
  local_3ec = local_808[0x38];
  local_818 = CONCAT44(local_3ec,local_3ec);
  uStack_810 = CONCAT44(local_3ec,local_3ec);
  local_3f0 = -local_808[8];
  local_828 = CONCAT44(local_3f0,local_3f0);
  uStack_820 = CONCAT44(local_3f0,local_3f0);
  local_3f4 = local_808[0x18];
  local_838 = CONCAT44(local_3f4,local_3f4);
  uStack_830 = CONCAT44(local_3f4,local_3f4);
  local_3f8 = -local_808[0x28];
  local_848 = CONCAT44(local_3f8,local_3f8);
  uStack_840 = CONCAT44(local_3f8,local_3f8);
  local_3fc = local_808[0x28];
  local_858 = CONCAT44(local_3fc,local_3fc);
  uStack_850 = CONCAT44(local_3fc,local_3fc);
  local_400 = local_808[8];
  local_868 = CONCAT44(local_400,local_400);
  uStack_860 = CONCAT44(local_400,local_400);
  local_404 = local_808[0x20];
  local_878 = CONCAT44(local_404,local_404);
  uStack_870 = CONCAT44(local_404,local_404);
  local_408 = local_808[0x30];
  local_888 = CONCAT44(local_408,local_408);
  uStack_880 = CONCAT44(local_408,local_408);
  local_40c = -local_808[0x10];
  local_898 = CONCAT44(local_40c,local_40c);
  uStack_890 = CONCAT44(local_40c,local_40c);
  local_410 = local_808[0x10];
  local_8a8 = CONCAT44(local_410,local_410);
  uStack_8a0 = CONCAT44(local_410,local_410);
  local_414 = 1 << ((char)local_7f4 - 1U & 0x1f);
  local_8b8 = CONCAT44(local_414,local_414);
  uStack_8b0 = CONCAT44(local_414,local_414);
  iVar58 = 8;
  if (local_7f8 != 0) {
    iVar58 = 6;
  }
  if (local_7fc + iVar58 < 0x10) {
    iVar58 = 0x10;
  }
  else {
    iVar58 = 8;
    if (local_7f8 != 0) {
      iVar58 = 6;
    }
    iVar58 = local_7fc + iVar58;
  }
  local_8bc._0_1_ = (char)iVar58;
  local_418 = -(1 << ((char)local_8bc - 1U & 0x1f));
  local_8d8 = CONCAT44(local_418,local_418);
  uStack_8d0 = CONCAT44(local_418,local_418);
  local_41c = (1 << ((char)local_8bc - 1U & 0x1f)) + -1;
  local_8e8 = CONCAT44(local_41c,local_41c);
  uStack_8e0 = CONCAT44(local_41c,local_41c);
  local_8bc = iVar58;
  local_1e8 = local_818;
  uStack_1e0 = uStack_810;
  local_1d8 = local_3ec;
  local_1d4 = local_3ec;
  local_1d0 = local_3ec;
  local_1cc = local_3ec;
  local_1c8 = local_828;
  uStack_1c0 = uStack_820;
  local_1b8 = local_3f0;
  local_1b4 = local_3f0;
  local_1b0 = local_3f0;
  local_1ac = local_3f0;
  local_1a8 = local_838;
  uStack_1a0 = uStack_830;
  local_198 = local_3f4;
  local_194 = local_3f4;
  local_190 = local_3f4;
  local_18c = local_3f4;
  local_188 = local_848;
  uStack_180 = uStack_840;
  local_178 = local_3f8;
  local_174 = local_3f8;
  local_170 = local_3f8;
  local_16c = local_3f8;
  local_168 = local_858;
  uStack_160 = uStack_850;
  local_158 = local_3fc;
  local_154 = local_3fc;
  local_150 = local_3fc;
  local_14c = local_3fc;
  local_148 = local_868;
  uStack_140 = uStack_860;
  local_138 = local_400;
  local_134 = local_400;
  local_130 = local_400;
  local_12c = local_400;
  local_128 = local_878;
  uStack_120 = uStack_870;
  local_118 = local_404;
  local_114 = local_404;
  local_110 = local_404;
  local_10c = local_404;
  local_108 = local_888;
  uStack_100 = uStack_880;
  local_f8 = local_408;
  local_f4 = local_408;
  local_f0 = local_408;
  local_ec = local_408;
  local_e8 = local_898;
  uStack_e0 = uStack_890;
  local_d8 = local_40c;
  local_d4 = local_40c;
  local_d0 = local_40c;
  local_cc = local_40c;
  local_c8 = local_8a8;
  uStack_c0 = uStack_8a0;
  local_b8 = local_410;
  local_b4 = local_410;
  local_b0 = local_410;
  local_ac = local_410;
  local_a8 = local_8b8;
  uStack_a0 = uStack_8b0;
  local_98 = local_414;
  local_94 = local_414;
  local_90 = local_414;
  local_8c = local_414;
  local_88 = local_8d8;
  uStack_80 = uStack_8d0;
  local_78 = local_418;
  local_74 = local_418;
  local_70 = local_418;
  local_6c = local_418;
  local_68 = local_8e8;
  uStack_60 = uStack_8e0;
  local_58 = local_41c;
  local_54 = local_41c;
  local_50 = local_41c;
  local_4c = local_41c;
  for (local_a0c = 0; local_a0c < 2; local_a0c = local_a0c + 1) {
    pauVar47 = (undefined1 (*) [16])(local_7e8 + (long)local_a0c * 0x10);
    local_8f8 = *(undefined8 *)*pauVar47;
    uStack_8f0 = *(undefined8 *)(*pauVar47 + 8);
    pauVar48 = (undefined1 (*) [16])(local_7e8 + (long)(local_a0c + 8) * 0x10);
    local_908 = *(undefined8 *)*pauVar48;
    uStack_900 = *(undefined8 *)(*pauVar48 + 8);
    pauVar49 = (undefined1 (*) [16])(local_7e8 + (long)(local_a0c + 4) * 0x10);
    local_918 = *(undefined8 *)*pauVar49;
    uStack_910 = *(undefined8 *)(*pauVar49 + 8);
    pauVar50 = (undefined1 (*) [16])(local_7e8 + (long)(local_a0c + 0xc) * 0x10);
    local_928 = *(undefined8 *)*pauVar50;
    uStack_920 = *(undefined8 *)(*pauVar50 + 8);
    pauVar51 = (undefined1 (*) [16])(local_7e8 + (long)(local_a0c + 2) * 0x10);
    local_1f8 = *(undefined8 *)*pauVar51;
    uStack_1f0 = *(undefined8 *)(*pauVar51 + 8);
    local_208 = local_818;
    uStack_200 = uStack_810;
    auVar16._8_8_ = uStack_810;
    auVar16._0_8_ = local_818;
    auVar53 = pmulld(*pauVar51,auVar16);
    pauVar51 = (undefined1 (*) [16])(local_7e8 + (long)(local_a0c + 0xe) * 0x10);
    local_218 = *(undefined8 *)*pauVar51;
    uStack_210 = *(undefined8 *)(*pauVar51 + 8);
    local_228 = local_828;
    uStack_220 = uStack_820;
    auVar15._8_8_ = uStack_820;
    auVar15._0_8_ = local_828;
    auVar54 = pmulld(*pauVar51,auVar15);
    local_9f8._0_8_ = auVar53._0_8_;
    local_9f8._8_8_ = auVar53._8_8_;
    local_a08._0_8_ = auVar54._0_8_;
    local_a08._8_8_ = auVar54._8_8_;
    local_478 = local_9f8._0_8_;
    uVar45 = local_478;
    uStack_470 = local_9f8._8_8_;
    uVar46 = uStack_470;
    local_488 = local_a08._0_8_;
    uVar43 = local_488;
    uStack_480 = local_a08._8_8_;
    uVar44 = uStack_480;
    local_478._0_4_ = auVar53._0_4_;
    local_478._4_4_ = auVar53._4_4_;
    uStack_470._0_4_ = auVar53._8_4_;
    uStack_470._4_4_ = auVar53._12_4_;
    local_488._0_4_ = auVar54._0_4_;
    local_488._4_4_ = auVar54._4_4_;
    uStack_480._0_4_ = auVar54._8_4_;
    uStack_480._4_4_ = auVar54._12_4_;
    local_938 = CONCAT44(local_478._4_4_ + local_488._4_4_,(int)local_478 + (int)local_488);
    uStack_930 = CONCAT44(uStack_470._4_4_ + uStack_480._4_4_,(int)uStack_470 + (int)uStack_480);
    local_498 = local_938;
    uStack_490 = uStack_930;
    local_4a8 = local_8b8;
    uVar41 = local_4a8;
    uStack_4a0 = uStack_8b0;
    uVar42 = uStack_4a0;
    local_4a8._0_4_ = (int)local_8b8;
    local_4a8._4_4_ = (int)((ulong)local_8b8 >> 0x20);
    uStack_4a0._0_4_ = (int)uStack_8b0;
    uStack_4a0._4_4_ = (int)((ulong)uStack_8b0 >> 0x20);
    iVar52 = (int)local_478 + (int)local_488 + (int)local_4a8;
    iVar55 = local_478._4_4_ + local_488._4_4_ + local_4a8._4_4_;
    iVar56 = (int)uStack_470 + (int)uStack_480 + (int)uStack_4a0;
    iVar57 = uStack_470._4_4_ + uStack_480._4_4_ + uStack_4a0._4_4_;
    local_938 = CONCAT44(iVar55,iVar52);
    uStack_930 = CONCAT44(iVar57,iVar56);
    local_6b8 = local_938;
    uStack_6b0 = uStack_930;
    local_6bc = local_7f4;
    auVar53 = ZEXT416(local_7f4);
    local_938 = CONCAT44(iVar55 >> auVar53,iVar52 >> auVar53);
    uStack_930 = CONCAT44(iVar57 >> auVar53,iVar56 >> auVar53);
    pauVar51 = (undefined1 (*) [16])(local_7e8 + (long)(local_a0c + 2) * 0x10);
    local_238 = *(undefined8 *)*pauVar51;
    uStack_230 = *(undefined8 *)(*pauVar51 + 8);
    local_248 = local_868;
    uStack_240 = uStack_860;
    auVar14._8_8_ = uStack_860;
    auVar14._0_8_ = local_868;
    auVar53 = pmulld(*pauVar51,auVar14);
    pauVar51 = (undefined1 (*) [16])(local_7e8 + (long)(local_a0c + 0xe) * 0x10);
    local_258 = *(undefined8 *)*pauVar51;
    uStack_250 = *(undefined8 *)(*pauVar51 + 8);
    local_268 = local_818;
    uStack_260 = uStack_810;
    auVar13._8_8_ = uStack_810;
    auVar13._0_8_ = local_818;
    auVar54 = pmulld(*pauVar51,auVar13);
    local_9f8._0_8_ = auVar53._0_8_;
    local_9f8._8_8_ = auVar53._8_8_;
    local_a08._0_8_ = auVar54._0_8_;
    local_a08._8_8_ = auVar54._8_8_;
    local_4b8 = local_9f8._0_8_;
    uVar39 = local_4b8;
    uStack_4b0 = local_9f8._8_8_;
    uVar40 = uStack_4b0;
    local_4c8 = local_a08._0_8_;
    uVar37 = local_4c8;
    uStack_4c0 = local_a08._8_8_;
    uVar38 = uStack_4c0;
    local_4b8._0_4_ = auVar53._0_4_;
    local_4b8._4_4_ = auVar53._4_4_;
    uStack_4b0._0_4_ = auVar53._8_4_;
    uStack_4b0._4_4_ = auVar53._12_4_;
    local_4c8._0_4_ = auVar54._0_4_;
    local_4c8._4_4_ = auVar54._4_4_;
    uStack_4c0._0_4_ = auVar54._8_4_;
    uStack_4c0._4_4_ = auVar54._12_4_;
    local_968 = CONCAT44(local_4b8._4_4_ + local_4c8._4_4_,(int)local_4b8 + (int)local_4c8);
    uStack_960 = CONCAT44(uStack_4b0._4_4_ + uStack_4c0._4_4_,(int)uStack_4b0 + (int)uStack_4c0);
    local_4d8 = local_968;
    uStack_4d0 = uStack_960;
    local_4e8 = local_8b8;
    uStack_4e0 = uStack_8b0;
    iVar52 = (int)local_4b8 + (int)local_4c8 + (int)local_4a8;
    iVar55 = local_4b8._4_4_ + local_4c8._4_4_ + local_4a8._4_4_;
    iVar56 = (int)uStack_4b0 + (int)uStack_4c0 + (int)uStack_4a0;
    iVar57 = uStack_4b0._4_4_ + uStack_4c0._4_4_ + uStack_4a0._4_4_;
    local_968 = CONCAT44(iVar55,iVar52);
    uStack_960 = CONCAT44(iVar57,iVar56);
    local_6d8 = local_968;
    uStack_6d0 = uStack_960;
    local_6dc = local_7f4;
    auVar53 = ZEXT416(local_7f4);
    local_968 = CONCAT44(iVar55 >> auVar53,iVar52 >> auVar53);
    uStack_960 = CONCAT44(iVar57 >> auVar53,iVar56 >> auVar53);
    pauVar51 = (undefined1 (*) [16])(local_7e8 + (long)(local_a0c + 10) * 0x10);
    local_278 = *(undefined8 *)*pauVar51;
    uStack_270 = *(undefined8 *)(*pauVar51 + 8);
    local_288 = local_838;
    uStack_280 = uStack_830;
    auVar12._8_8_ = uStack_830;
    auVar12._0_8_ = local_838;
    auVar53 = pmulld(*pauVar51,auVar12);
    pauVar51 = (undefined1 (*) [16])(local_7e8 + (long)(local_a0c + 6) * 0x10);
    local_298 = *(undefined8 *)*pauVar51;
    uStack_290 = *(undefined8 *)(*pauVar51 + 8);
    local_2a8 = local_848;
    uStack_2a0 = uStack_840;
    auVar11._8_8_ = uStack_840;
    auVar11._0_8_ = local_848;
    auVar54 = pmulld(*pauVar51,auVar11);
    local_9f8._0_8_ = auVar53._0_8_;
    local_9f8._8_8_ = auVar53._8_8_;
    local_a08._0_8_ = auVar54._0_8_;
    local_a08._8_8_ = auVar54._8_8_;
    local_4f8 = local_9f8._0_8_;
    uVar35 = local_4f8;
    uStack_4f0 = local_9f8._8_8_;
    uVar36 = uStack_4f0;
    local_508 = local_a08._0_8_;
    uVar33 = local_508;
    uStack_500 = local_a08._8_8_;
    uVar34 = uStack_500;
    local_4f8._0_4_ = auVar53._0_4_;
    local_4f8._4_4_ = auVar53._4_4_;
    uStack_4f0._0_4_ = auVar53._8_4_;
    uStack_4f0._4_4_ = auVar53._12_4_;
    local_508._0_4_ = auVar54._0_4_;
    local_508._4_4_ = auVar54._4_4_;
    uStack_500._0_4_ = auVar54._8_4_;
    uStack_500._4_4_ = auVar54._12_4_;
    local_518 = CONCAT44(local_4f8._4_4_ + local_508._4_4_,(int)local_4f8 + (int)local_508);
    uStack_510 = CONCAT44(uStack_4f0._4_4_ + uStack_500._4_4_,(int)uStack_4f0 + (int)uStack_500);
    local_528 = local_8b8;
    uStack_520 = uStack_8b0;
    local_948 = (int)local_4f8 + (int)local_508 + (int)local_4a8;
    iStack_944 = local_4f8._4_4_ + local_508._4_4_ + local_4a8._4_4_;
    iStack_940 = (int)uStack_4f0 + (int)uStack_500 + (int)uStack_4a0;
    iStack_93c = uStack_4f0._4_4_ + uStack_500._4_4_ + uStack_4a0._4_4_;
    local_6f8 = CONCAT44(iStack_944,local_948);
    uStack_6f0 = CONCAT44(iStack_93c,iStack_940);
    local_6fc = local_7f4;
    auVar53 = ZEXT416(local_7f4);
    local_948 = local_948 >> auVar53;
    iStack_944 = iStack_944 >> auVar53;
    iStack_940 = iStack_940 >> auVar53;
    iStack_93c = iStack_93c >> auVar53;
    pauVar51 = (undefined1 (*) [16])(local_7e8 + (long)(local_a0c + 10) * 0x10);
    local_2b8 = *(undefined8 *)*pauVar51;
    uStack_2b0 = *(undefined8 *)(*pauVar51 + 8);
    local_2c8 = local_858;
    uStack_2c0 = uStack_850;
    auVar10._8_8_ = uStack_850;
    auVar10._0_8_ = local_858;
    auVar53 = pmulld(*pauVar51,auVar10);
    pauVar51 = (undefined1 (*) [16])(local_7e8 + (long)(local_a0c + 6) * 0x10);
    local_2d8 = *(undefined8 *)*pauVar51;
    uStack_2d0 = *(undefined8 *)(*pauVar51 + 8);
    local_2e8 = local_838;
    uStack_2e0 = uStack_830;
    auVar9._8_8_ = uStack_830;
    auVar9._0_8_ = local_838;
    auVar54 = pmulld(*pauVar51,auVar9);
    local_9f8._0_8_ = auVar53._0_8_;
    local_9f8._8_8_ = auVar53._8_8_;
    local_a08._0_8_ = auVar54._0_8_;
    local_a08._8_8_ = auVar54._8_8_;
    local_538 = local_9f8._0_8_;
    uVar31 = local_538;
    uStack_530 = local_9f8._8_8_;
    uVar32 = uStack_530;
    local_548 = local_a08._0_8_;
    uVar29 = local_548;
    uStack_540 = local_a08._8_8_;
    uVar30 = uStack_540;
    local_538._0_4_ = auVar53._0_4_;
    local_538._4_4_ = auVar53._4_4_;
    uStack_530._0_4_ = auVar53._8_4_;
    uStack_530._4_4_ = auVar53._12_4_;
    local_548._0_4_ = auVar54._0_4_;
    local_548._4_4_ = auVar54._4_4_;
    uStack_540._0_4_ = auVar54._8_4_;
    uStack_540._4_4_ = auVar54._12_4_;
    local_558 = CONCAT44(local_538._4_4_ + local_548._4_4_,(int)local_538 + (int)local_548);
    uStack_550 = CONCAT44(uStack_530._4_4_ + uStack_540._4_4_,(int)uStack_530 + (int)uStack_540);
    local_568 = local_8b8;
    uStack_560 = uStack_8b0;
    local_958 = (int)local_538 + (int)local_548 + (int)local_4a8;
    iStack_954 = local_538._4_4_ + local_548._4_4_ + local_4a8._4_4_;
    iStack_950 = (int)uStack_530 + (int)uStack_540 + (int)uStack_4a0;
    iStack_94c = uStack_530._4_4_ + uStack_540._4_4_ + uStack_4a0._4_4_;
    local_718 = CONCAT44(iStack_954,local_958);
    uStack_710 = CONCAT44(iStack_94c,iStack_950);
    local_71c = local_7f4;
    auVar53 = ZEXT416(local_7f4);
    local_958 = local_958 >> auVar53;
    iStack_954 = iStack_954 >> auVar53;
    iStack_950 = iStack_950 >> auVar53;
    iStack_94c = iStack_94c >> auVar53;
    local_308 = local_878;
    uStack_300 = uStack_870;
    auVar8._8_8_ = uStack_870;
    auVar8._0_8_ = local_878;
    auVar53 = pmulld(*pauVar47,auVar8);
    local_328 = local_878;
    uStack_320 = uStack_870;
    auVar7._8_8_ = uStack_870;
    auVar7._0_8_ = local_878;
    auVar54 = pmulld(*pauVar48,auVar7);
    local_9f8._0_8_ = auVar53._0_8_;
    local_9f8._8_8_ = auVar53._8_8_;
    local_a08._0_8_ = auVar54._0_8_;
    local_a08._8_8_ = auVar54._8_8_;
    local_578 = local_9f8._0_8_;
    uVar27 = local_578;
    uStack_570 = local_9f8._8_8_;
    uVar28 = uStack_570;
    local_588 = local_a08._0_8_;
    uVar25 = local_588;
    uStack_580 = local_a08._8_8_;
    uVar26 = uStack_580;
    local_578._0_4_ = auVar53._0_4_;
    local_578._4_4_ = auVar53._4_4_;
    uStack_570._0_4_ = auVar53._8_4_;
    uStack_570._4_4_ = auVar53._12_4_;
    local_588._0_4_ = auVar54._0_4_;
    local_588._4_4_ = auVar54._4_4_;
    uStack_580._0_4_ = auVar54._8_4_;
    uStack_580._4_4_ = auVar54._12_4_;
    local_598 = CONCAT44(local_578._4_4_ + local_588._4_4_,(int)local_578 + (int)local_588);
    uStack_590 = CONCAT44(uStack_570._4_4_ + uStack_580._4_4_,(int)uStack_570 + (int)uStack_580);
    local_5a8 = local_8b8;
    uStack_5a0 = uStack_8b0;
    local_978 = (int)local_578 + (int)local_588 + (int)local_4a8;
    iStack_974 = local_578._4_4_ + local_588._4_4_ + local_4a8._4_4_;
    iStack_970 = (int)uStack_570 + (int)uStack_580 + (int)uStack_4a0;
    iStack_96c = uStack_570._4_4_ + uStack_580._4_4_ + uStack_4a0._4_4_;
    local_738 = CONCAT44(iStack_974,local_978);
    uStack_730 = CONCAT44(iStack_96c,iStack_970);
    local_73c = local_7f4;
    auVar53 = ZEXT416(local_7f4);
    local_978 = local_978 >> auVar53;
    iStack_974 = iStack_974 >> auVar53;
    iStack_970 = iStack_970 >> auVar53;
    iStack_96c = iStack_96c >> auVar53;
    local_438 = local_9f8._0_8_;
    uStack_430 = local_9f8._8_8_;
    local_448 = local_a08._0_8_;
    uStack_440 = local_a08._8_8_;
    local_5b8 = CONCAT44(local_578._4_4_ - local_588._4_4_,(int)local_578 - (int)local_588);
    uStack_5b0 = CONCAT44(uStack_570._4_4_ - uStack_580._4_4_,(int)uStack_570 - (int)uStack_580);
    local_5c8 = local_8b8;
    uStack_5c0 = uStack_8b0;
    local_988 = ((int)local_578 - (int)local_588) + (int)local_4a8;
    iStack_984 = (local_578._4_4_ - local_588._4_4_) + local_4a8._4_4_;
    iStack_980 = ((int)uStack_570 - (int)uStack_580) + (int)uStack_4a0;
    iStack_97c = (uStack_570._4_4_ - uStack_580._4_4_) + uStack_4a0._4_4_;
    local_758 = CONCAT44(iStack_984,local_988);
    uStack_750 = CONCAT44(iStack_97c,iStack_980);
    local_75c = local_7f4;
    auVar53 = ZEXT416(local_7f4);
    local_988 = local_988 >> auVar53;
    iStack_984 = iStack_984 >> auVar53;
    iStack_980 = iStack_980 >> auVar53;
    iStack_97c = iStack_97c >> auVar53;
    local_348 = local_888;
    uStack_340 = uStack_880;
    auVar6._8_8_ = uStack_880;
    auVar6._0_8_ = local_888;
    auVar53 = pmulld(*pauVar49,auVar6);
    local_368 = local_898;
    uStack_360 = uStack_890;
    auVar5._8_8_ = uStack_890;
    auVar5._0_8_ = local_898;
    auVar54 = pmulld(*pauVar50,auVar5);
    local_9f8._0_8_ = auVar53._0_8_;
    local_9f8._8_8_ = auVar53._8_8_;
    local_a08._0_8_ = auVar54._0_8_;
    local_a08._8_8_ = auVar54._8_8_;
    local_5d8 = local_9f8._0_8_;
    uVar23 = local_5d8;
    uStack_5d0 = local_9f8._8_8_;
    uVar24 = uStack_5d0;
    local_5e8 = local_a08._0_8_;
    uVar21 = local_5e8;
    uStack_5e0 = local_a08._8_8_;
    uVar22 = uStack_5e0;
    local_5d8._0_4_ = auVar53._0_4_;
    local_5d8._4_4_ = auVar53._4_4_;
    uStack_5d0._0_4_ = auVar53._8_4_;
    uStack_5d0._4_4_ = auVar53._12_4_;
    local_5e8._0_4_ = auVar54._0_4_;
    local_5e8._4_4_ = auVar54._4_4_;
    uStack_5e0._0_4_ = auVar54._8_4_;
    uStack_5e0._4_4_ = auVar54._12_4_;
    local_5f8 = CONCAT44(local_5d8._4_4_ + local_5e8._4_4_,(int)local_5d8 + (int)local_5e8);
    uStack_5f0 = CONCAT44(uStack_5d0._4_4_ + uStack_5e0._4_4_,(int)uStack_5d0 + (int)uStack_5e0);
    local_608 = local_8b8;
    uStack_600 = uStack_8b0;
    local_998 = (int)local_5d8 + (int)local_5e8 + (int)local_4a8;
    iStack_994 = local_5d8._4_4_ + local_5e8._4_4_ + local_4a8._4_4_;
    iStack_990 = (int)uStack_5d0 + (int)uStack_5e0 + (int)uStack_4a0;
    iStack_98c = uStack_5d0._4_4_ + uStack_5e0._4_4_ + uStack_4a0._4_4_;
    local_778 = CONCAT44(iStack_994,local_998);
    uStack_770 = CONCAT44(iStack_98c,iStack_990);
    local_77c = local_7f4;
    auVar53 = ZEXT416(local_7f4);
    local_998 = local_998 >> auVar53;
    iStack_994 = iStack_994 >> auVar53;
    iStack_990 = iStack_990 >> auVar53;
    iStack_98c = iStack_98c >> auVar53;
    local_388 = local_8a8;
    uStack_380 = uStack_8a0;
    auVar4._8_8_ = uStack_8a0;
    auVar4._0_8_ = local_8a8;
    local_9f8 = pmulld(*pauVar49,auVar4);
    local_3a8 = local_888;
    uStack_3a0 = uStack_880;
    auVar3._8_8_ = uStack_880;
    auVar3._0_8_ = local_888;
    local_a08 = pmulld(*pauVar50,auVar3);
    local_618 = local_9f8._0_8_;
    uVar19 = local_618;
    uStack_610 = local_9f8._8_8_;
    uVar20 = uStack_610;
    local_628 = local_a08._0_8_;
    uVar17 = local_628;
    uStack_620 = local_a08._8_8_;
    uVar18 = uStack_620;
    local_618._0_4_ = local_9f8._0_4_;
    local_618._4_4_ = local_9f8._4_4_;
    uStack_610._0_4_ = local_9f8._8_4_;
    uStack_610._4_4_ = local_9f8._12_4_;
    local_628._0_4_ = local_a08._0_4_;
    local_628._4_4_ = local_a08._4_4_;
    uStack_620._0_4_ = local_a08._8_4_;
    uStack_620._4_4_ = local_a08._12_4_;
    local_638 = CONCAT44(local_618._4_4_ + local_628._4_4_,(int)local_618 + (int)local_628);
    uStack_630 = CONCAT44(uStack_610._4_4_ + uStack_620._4_4_,(int)uStack_610 + (int)uStack_620);
    local_648 = local_8b8;
    uStack_640 = uStack_8b0;
    local_4a8._0_4_ = (int)local_618 + (int)local_628 + (int)local_4a8;
    local_4a8._4_4_ = local_618._4_4_ + local_628._4_4_ + local_4a8._4_4_;
    uStack_4a0._0_4_ = (int)uStack_610 + (int)uStack_620 + (int)uStack_4a0;
    uStack_4a0._4_4_ = uStack_610._4_4_ + uStack_620._4_4_ + uStack_4a0._4_4_;
    local_798 = CONCAT44(local_4a8._4_4_,(int)local_4a8);
    uStack_790 = CONCAT44(uStack_4a0._4_4_,(int)uStack_4a0);
    local_79c = local_7f4;
    auVar53 = ZEXT416(local_7f4);
    local_9a8 = (int)local_4a8 >> auVar53;
    iStack_9a4 = local_4a8._4_4_ >> auVar53;
    iStack_9a0 = (int)uStack_4a0 >> auVar53;
    iStack_99c = uStack_4a0._4_4_ >> auVar53;
    in0[1] = (longlong)&local_9c8;
    in0[0] = (longlong)&local_9b8;
    in1[1] = (longlong)&local_8e8;
    in1[0] = (longlong)&local_8d8;
    local_628 = uVar17;
    uStack_620 = uVar18;
    local_618 = uVar19;
    uStack_610 = uVar20;
    local_5e8 = uVar21;
    uStack_5e0 = uVar22;
    local_5d8 = uVar23;
    uStack_5d0 = uVar24;
    local_588 = uVar25;
    uStack_580 = uVar26;
    local_578 = uVar27;
    uStack_570 = uVar28;
    local_548 = uVar29;
    uStack_540 = uVar30;
    local_538 = uVar31;
    uStack_530 = uVar32;
    local_508 = uVar33;
    uStack_500 = uVar34;
    local_4f8 = uVar35;
    uStack_4f0 = uVar36;
    local_4c8 = uVar37;
    uStack_4c0 = uVar38;
    local_4b8 = uVar39;
    uStack_4b0 = uVar40;
    local_4a8 = uVar41;
    uStack_4a0 = uVar42;
    local_488 = uVar43;
    uStack_480 = uVar44;
    local_478 = uVar45;
    uStack_470 = uVar46;
    local_398 = local_928;
    uStack_390 = uStack_920;
    local_378 = local_918;
    uStack_370 = uStack_910;
    local_358 = local_928;
    uStack_350 = uStack_920;
    local_338 = local_918;
    uStack_330 = uStack_910;
    local_318 = local_908;
    uStack_310 = uStack_900;
    local_2f8 = local_8f8;
    uStack_2f0 = uStack_8f0;
    addsub_sse4_1(in0,in1,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                  (__m128i *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                  (__m128i *)CONCAT44(iVar58,in_stack_fffffffffffff5c0));
    in0_00[1] = (longlong)&local_9d8;
    in0_00[0] = (longlong)&local_9e8;
    in1_00[1] = (longlong)&local_8e8;
    in1_00[0] = (longlong)&local_8d8;
    addsub_sse4_1(in0_00,in1_00,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                  (__m128i *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                  (__m128i *)CONCAT44(iVar58,in_stack_fffffffffffff5c0));
    in0_01[1] = (longlong)&local_928;
    in0_01[0] = (longlong)&local_8f8;
    in1_01[1] = (longlong)&local_8e8;
    in1_01[0] = (longlong)&local_8d8;
    addsub_sse4_1(in0_01,in1_01,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                  (__m128i *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                  (__m128i *)CONCAT44(iVar58,in_stack_fffffffffffff5c0));
    in0_02[1] = (longlong)&local_918;
    in0_02[0] = (longlong)&local_908;
    in1_02[1] = (longlong)&local_8e8;
    in1_02[0] = (longlong)&local_8d8;
    addsub_sse4_1(in0_02,in1_02,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                  (__m128i *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                  (__m128i *)CONCAT44(iVar58,in_stack_fffffffffffff5c0));
    local_938 = local_9b8;
    uStack_930 = uStack_9b0;
    local_968 = local_9e8;
    uStack_960 = uStack_9e0;
    local_3b8 = local_9c8;
    uStack_3b0 = uStack_9c0;
    local_3c8 = local_878;
    uStack_3c0 = uStack_870;
    auVar2._8_8_ = uStack_9c0;
    auVar2._0_8_ = local_9c8;
    auVar1._8_8_ = uStack_870;
    auVar1._0_8_ = local_878;
    local_9f8 = pmulld(auVar2,auVar1);
    local_3d8 = local_9d8;
    uStack_3d0 = uStack_9d0;
    local_3e8 = local_878;
    uStack_3e0 = uStack_870;
    auVar54._8_8_ = uStack_9d0;
    auVar54._0_8_ = local_9d8;
    auVar53._8_8_ = uStack_870;
    auVar53._0_8_ = local_878;
    local_a08 = pmulld(auVar54,auVar53);
    local_658 = local_a08._0_8_;
    uVar21 = local_658;
    uStack_650 = local_a08._8_8_;
    uVar22 = uStack_650;
    local_668 = local_9f8._0_8_;
    uVar19 = local_668;
    uStack_660 = local_9f8._8_8_;
    uVar20 = uStack_660;
    local_658._0_4_ = local_a08._0_4_;
    local_658._4_4_ = local_a08._4_4_;
    uStack_650._0_4_ = local_a08._8_4_;
    uStack_650._4_4_ = local_a08._12_4_;
    local_668._0_4_ = local_9f8._0_4_;
    local_668._4_4_ = local_9f8._4_4_;
    uStack_660._0_4_ = local_9f8._8_4_;
    uStack_660._4_4_ = local_9f8._12_4_;
    local_678 = CONCAT44(local_658._4_4_ + local_668._4_4_,(int)local_658 + (int)local_668);
    uStack_670 = CONCAT44(uStack_650._4_4_ + uStack_660._4_4_,(int)uStack_650 + (int)uStack_660);
    local_688 = local_8b8;
    uVar17 = local_688;
    uStack_680 = uStack_8b0;
    uVar18 = uStack_680;
    local_688._0_4_ = (int)local_8b8;
    local_688._4_4_ = (int)((ulong)local_8b8 >> 0x20);
    uStack_680._0_4_ = (int)uStack_8b0;
    uStack_680._4_4_ = (int)((ulong)uStack_8b0 >> 0x20);
    local_958 = (int)local_658 + (int)local_668 + (int)local_688;
    iStack_954 = local_658._4_4_ + local_668._4_4_ + local_688._4_4_;
    iStack_950 = (int)uStack_650 + (int)uStack_660 + (int)uStack_680;
    iStack_94c = uStack_650._4_4_ + uStack_660._4_4_ + uStack_680._4_4_;
    local_7b8 = CONCAT44(iStack_954,local_958);
    uStack_7b0 = CONCAT44(iStack_94c,iStack_950);
    local_7bc = local_7f4;
    auVar53 = ZEXT416(local_7f4);
    local_958 = local_958 >> auVar53;
    iStack_954 = iStack_954 >> auVar53;
    iStack_950 = iStack_950 >> auVar53;
    iStack_94c = iStack_94c >> auVar53;
    local_458 = local_a08._0_8_;
    uStack_450 = local_a08._8_8_;
    local_468 = local_9f8._0_8_;
    uStack_460 = local_9f8._8_8_;
    local_698 = CONCAT44(local_658._4_4_ - local_668._4_4_,(int)local_658 - (int)local_668);
    uStack_690 = CONCAT44(uStack_650._4_4_ - uStack_660._4_4_,(int)uStack_650 - (int)uStack_660);
    local_6a8 = local_8b8;
    uStack_6a0 = uStack_8b0;
    local_688._0_4_ = ((int)local_658 - (int)local_668) + (int)local_688;
    local_688._4_4_ = (local_658._4_4_ - local_668._4_4_) + local_688._4_4_;
    uStack_680._0_4_ = ((int)uStack_650 - (int)uStack_660) + (int)uStack_680;
    uStack_680._4_4_ = (uStack_650._4_4_ - uStack_660._4_4_) + uStack_680._4_4_;
    local_7d8 = CONCAT44(local_688._4_4_,(int)local_688);
    uStack_7d0 = CONCAT44(uStack_680._4_4_,(int)uStack_680);
    local_7dc = local_7f4;
    auVar53 = ZEXT416(local_7f4);
    local_948 = (int)local_688 >> auVar53;
    iStack_944 = local_688._4_4_ >> auVar53;
    iStack_940 = (int)uStack_680 >> auVar53;
    iStack_93c = uStack_680._4_4_ >> auVar53;
    in0_03[0] = local_7f0 + local_a0c;
    in0_03[1] = local_7f0 + (long)local_a0c + 0xe;
    in1_03[1] = (longlong)&local_8e8;
    in1_03[0] = (longlong)&local_8d8;
    local_688 = uVar17;
    uStack_680 = uVar18;
    local_668 = uVar19;
    uStack_660 = uVar20;
    local_658 = uVar21;
    uStack_650 = uVar22;
    addsub_sse4_1(in0_03,in1_03,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                  (__m128i *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                  (__m128i *)CONCAT44(iVar58,in_stack_fffffffffffff5c0));
    in0_04[0] = local_7f0 + (long)local_a0c + 2;
    in0_04[1] = local_7f0 + (long)local_a0c + 0xc;
    in1_04[1] = (longlong)&local_8e8;
    in1_04[0] = (longlong)&local_8d8;
    addsub_sse4_1(in0_04,in1_04,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                  (__m128i *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                  (__m128i *)CONCAT44(iVar58,in_stack_fffffffffffff5c0));
    in0_05[0] = local_7f0 + (long)local_a0c + 4;
    in0_05[1] = local_7f0 + (long)local_a0c + 10;
    in1_05[1] = (longlong)&local_8e8;
    in1_05[0] = (longlong)&local_8d8;
    addsub_sse4_1(in0_05,in1_05,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                  (__m128i *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                  (__m128i *)CONCAT44(iVar58,in_stack_fffffffffffff5c0));
    in0_06[0] = local_7f0 + (long)local_a0c + 6;
    in0_06[1] = local_7f0 + (long)local_a0c + 8;
    in1_06[1] = (longlong)&local_8e8;
    in1_06[0] = (longlong)&local_8d8;
    addsub_sse4_1(in0_06,in1_06,in_R8,(__m128i *)CONCAT44(in_register_0000008c,in_R9D),
                  (__m128i *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                  (__m128i *)CONCAT44(iVar58,in_stack_fffffffffffff5c0));
  }
  if (local_7f8 == 0) {
    if (local_7fc + 6 < 0x10) {
      local_a10 = 0x10;
    }
    else {
      local_a10 = local_7fc + 6;
    }
    local_420 = -(1 << ((char)local_a10 - 1U & 0x1f));
    local_a28 = CONCAT44(local_420,local_420);
    lStack_a20 = CONCAT44(local_420,local_420);
    local_424 = (1 << ((char)local_a10 - 1U & 0x1f)) + -1;
    local_a38 = CONCAT44(local_424,local_424);
    lStack_a30 = CONCAT44(local_424,local_424);
    local_48 = local_a28;
    lStack_40 = lStack_a20;
    local_38 = local_420;
    local_34 = local_420;
    local_30 = local_420;
    local_2c = local_420;
    local_28 = local_a38;
    lStack_20 = lStack_a30;
    local_10 = local_424;
    local_c = local_424;
    local_8 = local_424;
    local_4 = local_424;
    round_shift_8x8((__m128i *)CONCAT44(iVar58,local_a10),in_stack_fffffffffffff5bc);
    highbd_clamp_epi32_sse4_1(local_7f0,local_7f0,(__m128i *)&local_a28,(__m128i *)&local_a38,0x10);
  }
  return;
}

Assistant:

static void idct8x8_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                           int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u0, u1, u2, u3, u4, u5, u6, u7;
  __m128i v0, v1, v2, v3, v4, v5, v6, v7;
  __m128i x, y;
  int col;

  // Note:
  //  Even column: 0, 2, ..., 14
  //  Odd column: 1, 3, ..., 15
  //  one even column plus one odd column constructs one row (8 coeffs)
  //  total we have 8 rows (8x8).
  for (col = 0; col < 2; ++col) {
    // stage 0
    // stage 1
    // stage 2
    u0 = in[0 * 2 + col];
    u1 = in[4 * 2 + col];
    u2 = in[2 * 2 + col];
    u3 = in[6 * 2 + col];

    x = _mm_mullo_epi32(in[1 * 2 + col], cospi56);
    y = _mm_mullo_epi32(in[7 * 2 + col], cospim8);
    u4 = _mm_add_epi32(x, y);
    u4 = _mm_add_epi32(u4, rnding);
    u4 = _mm_srai_epi32(u4, bit);

    x = _mm_mullo_epi32(in[1 * 2 + col], cospi8);
    y = _mm_mullo_epi32(in[7 * 2 + col], cospi56);
    u7 = _mm_add_epi32(x, y);
    u7 = _mm_add_epi32(u7, rnding);
    u7 = _mm_srai_epi32(u7, bit);

    x = _mm_mullo_epi32(in[5 * 2 + col], cospi24);
    y = _mm_mullo_epi32(in[3 * 2 + col], cospim40);
    u5 = _mm_add_epi32(x, y);
    u5 = _mm_add_epi32(u5, rnding);
    u5 = _mm_srai_epi32(u5, bit);

    x = _mm_mullo_epi32(in[5 * 2 + col], cospi40);
    y = _mm_mullo_epi32(in[3 * 2 + col], cospi24);
    u6 = _mm_add_epi32(x, y);
    u6 = _mm_add_epi32(u6, rnding);
    u6 = _mm_srai_epi32(u6, bit);

    // stage 3
    x = _mm_mullo_epi32(u0, cospi32);
    y = _mm_mullo_epi32(u1, cospi32);
    v0 = _mm_add_epi32(x, y);
    v0 = _mm_add_epi32(v0, rnding);
    v0 = _mm_srai_epi32(v0, bit);

    v1 = _mm_sub_epi32(x, y);
    v1 = _mm_add_epi32(v1, rnding);
    v1 = _mm_srai_epi32(v1, bit);

    x = _mm_mullo_epi32(u2, cospi48);
    y = _mm_mullo_epi32(u3, cospim16);
    v2 = _mm_add_epi32(x, y);
    v2 = _mm_add_epi32(v2, rnding);
    v2 = _mm_srai_epi32(v2, bit);

    x = _mm_mullo_epi32(u2, cospi16);
    y = _mm_mullo_epi32(u3, cospi48);
    v3 = _mm_add_epi32(x, y);
    v3 = _mm_add_epi32(v3, rnding);
    v3 = _mm_srai_epi32(v3, bit);

    addsub_sse4_1(u4, u5, &v4, &v5, &clamp_lo, &clamp_hi);
    addsub_sse4_1(u7, u6, &v7, &v6, &clamp_lo, &clamp_hi);

    // stage 4
    addsub_sse4_1(v0, v3, &u0, &u3, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v1, v2, &u1, &u2, &clamp_lo, &clamp_hi);
    u4 = v4;
    u7 = v7;

    x = _mm_mullo_epi32(v5, cospi32);
    y = _mm_mullo_epi32(v6, cospi32);
    u6 = _mm_add_epi32(y, x);
    u6 = _mm_add_epi32(u6, rnding);
    u6 = _mm_srai_epi32(u6, bit);

    u5 = _mm_sub_epi32(y, x);
    u5 = _mm_add_epi32(u5, rnding);
    u5 = _mm_srai_epi32(u5, bit);

    // stage 5
    addsub_sse4_1(u0, u7, out + 0 * 2 + col, out + 7 * 2 + col, &clamp_lo,
                  &clamp_hi);
    addsub_sse4_1(u1, u6, out + 1 * 2 + col, out + 6 * 2 + col, &clamp_lo,
                  &clamp_hi);
    addsub_sse4_1(u2, u5, out + 2 * 2 + col, out + 5 * 2 + col, &clamp_lo,
                  &clamp_hi);
    addsub_sse4_1(u3, u4, out + 3 * 2 + col, out + 4 * 2 + col, &clamp_lo,
                  &clamp_hi);
  }

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);
    round_shift_8x8(out, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo_out, &clamp_hi_out, 16);
  }
}